

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<int_*const_&,_int_*const_&> * __thiscall
Catch::ExprLhs<int*const&>::operator==
          (BinaryExpr<int_*const_&,_int_*const_&> *__return_storage_ptr__,ExprLhs<int*const&> *this,
          int **rhs)

{
  int **ppiVar1;
  int *piVar2;
  int *piVar3;
  StringRef local_40;
  
  ppiVar1 = *(int ***)this;
  piVar2 = *ppiVar1;
  piVar3 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = piVar2 == piVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021df10;
  __return_storage_ptr__->m_lhs = ppiVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }